

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O1

void __thiscall ArrayType::~ArrayType(ArrayType *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Type).super_DataDepElement._vptr_DataDepElement =
       (_func_int **)&PTR__ArrayType_00143fe8;
  if (this->arraylength_var_field_ != (Field *)0x0) {
    (*(this->arraylength_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_it_var_field_ != (Field *)0x0) {
    (*(this->elem_it_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_var_field_ != (Field *)0x0) {
    (*(this->elem_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_dataptr_var_field_ != (Field *)0x0) {
    (*(this->elem_dataptr_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_input_var_field_ != (Field *)0x0) {
    (*(this->elem_input_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_dataptr_until_expr_ != (Expr *)0x0) {
    (*(this->elem_dataptr_until_expr_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  pcVar2 = (this->end_of_array_loop_label_)._M_dataplus._M_p;
  paVar1 = &(this->end_of_array_loop_label_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->datatype_str_)._M_dataplus._M_p;
  paVar1 = &(this->datatype_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->vector_str_)._M_dataplus._M_p;
  paVar1 = &(this->vector_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Type::~Type(&this->super_Type);
  return;
}

Assistant:

ArrayType::~ArrayType()
	{
	delete arraylength_var_field_;
	delete elem_it_var_field_;
	delete elem_var_field_;
	delete elem_dataptr_var_field_;
	delete elem_input_var_field_;

	delete elem_dataptr_until_expr_;
	}